

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * sqlite3VectorFieldSubexpr(Expr *pVector,int i)

{
  int iVar1;
  
  iVar1 = sqlite3ExprIsVector(pVector);
  if (iVar1 != 0) {
    if ((pVector->op == 0x8a) || (pVector->op2 == 0x8a)) {
      pVector = (Expr *)(pVector->x).pSelect;
    }
    pVector = ((anon_union_8_2_a01b6dbf_for_x *)&((Select *)pVector)->pEList)->pList->a[i].pExpr;
  }
  return pVector;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3VectorFieldSubexpr(Expr *pVector, int i){
  assert( i<sqlite3ExprVectorSize(pVector) || pVector->op==TK_ERROR );
  if( sqlite3ExprIsVector(pVector) ){
    assert( pVector->op2==0 || pVector->op==TK_REGISTER );
    if( pVector->op==TK_SELECT || pVector->op2==TK_SELECT ){
      assert( ExprUseXSelect(pVector) );
      return pVector->x.pSelect->pEList->a[i].pExpr;
    }else{
      assert( ExprUseXList(pVector) );
      return pVector->x.pList->a[i].pExpr;
    }
  }
  return pVector;
}